

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  pointer pAVar4;
  pointer pAVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  bool *pbVar9;
  char *pcVar10;
  pointer pOVar11;
  int iVar12;
  int k;
  long lVar13;
  char *pcVar14;
  int local_5c;
  size_t arg_index;
  char **local_48;
  pointer local_40;
  char *local_38;
  
  arg_index = 0;
  iVar7 = 1;
  local_48 = argv;
  do {
    if (argc <= iVar7) {
      pAVar5 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar4 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((pAVar5 != pAVar4) && (pAVar4[-1].handled_count == 0)) {
        lVar3 = arg_index * 0x50;
        for (sVar8 = arg_index; sVar8 < (ulong)(((long)pAVar4 - (long)pAVar5) / 0x50);
            sVar8 = sVar8 + 1) {
          Errorf(this,"expected %s argument.",
                 *(undefined8 *)((long)&(pAVar5->name)._M_dataplus._M_p + lVar3));
          pAVar5 = (this->arguments_).
                   super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar4 = (this->arguments_).
                   super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar3 = lVar3 + 0x50;
        }
      }
      return;
    }
    pcVar14 = argv[iVar7];
    if ((*pcVar14 == '-') && (cVar1 = pcVar14[1], cVar1 != '\0')) {
      if (cVar1 == '-') {
        local_40 = (this->options_).
                   super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = (long)(this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)local_40;
        local_38 = pcVar14 + 2;
        pbVar9 = &local_40->has_argument;
        iVar6 = 0;
        iVar12 = 0;
        local_5c = -1;
        for (lVar13 = 0; argv = local_48, lVar3 / 0x90 != lVar13; lVar13 = lVar13 + 1) {
          if (*(size_type *)(pbVar9 + -0x38) != 0) {
            iVar2 = Match(local_38,(string *)(pbVar9 + -0x40),*pbVar9);
            if (iVar12 < iVar2) {
              iVar6 = 1;
              local_5c = (int)lVar13;
              iVar12 = iVar2;
            }
            else {
              iVar6 = iVar6 + (uint)(0 < iVar12 && iVar2 == iVar12);
            }
          }
          pbVar9 = pbVar9 + 0x90;
        }
        if (iVar6 < 2) {
          if (iVar6 == 0) {
            pcVar10 = "unknown option \'%s\'";
LAB_0022bf9d:
            Errorf(this,pcVar10,pcVar14);
          }
          else {
            lVar3 = (long)local_5c;
            iVar6 = iVar7;
            if (local_40[lVar3].has_argument == true) {
              if ((pcVar14[(long)iVar12 + 1] == '\0') || (pcVar14[(long)iVar12 + 2] != '=')) {
                iVar6 = iVar7 + 1;
                if ((iVar6 == argc) || (pcVar14 = local_48[iVar6], *pcVar14 == '-')) {
                  pcVar14 = local_40[lVar3].long_name._M_dataplus._M_p;
                  pcVar10 = "option \'--%s\' requires argument";
                  goto LAB_0022bf9d;
                }
              }
              else {
                pcVar14 = pcVar14 + (long)iVar12 + 3;
              }
            }
            else {
              pcVar14 = (char *)0x0;
            }
            iVar7 = iVar6;
            std::function<void_(const_char_*)>::operator()(&local_40[lVar3].callback,pcVar14);
          }
        }
        else {
          Errorf(this,"ambiguous option \'%s\'",pcVar14);
          argv = local_48;
        }
      }
      else {
        lVar3 = 1;
        while (cVar1 != '\0') {
          for (pOVar11 = (this->options_).
                         super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pOVar11 !=
              (this->options_).
              super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
              ._M_impl.super__Vector_impl_data._M_finish; pOVar11 = pOVar11 + 1) {
            if (cVar1 == pOVar11->short_name) {
              if (pOVar11->has_argument == true) {
                if (((pcVar14[lVar3 + 1] != '\0') || (iVar6 = iVar7 + 1, iVar6 == argc)) ||
                   (pcVar10 = argv[iVar6], *pcVar10 == '-')) {
                  Errorf(this,"option \'-%c\' requires argument",(ulong)(uint)(int)cVar1);
                  break;
                }
              }
              else {
                pcVar10 = (char *)0x0;
                iVar6 = iVar7;
              }
              std::function<void_(const_char_*)>::operator()(&pOVar11->callback,pcVar10);
              iVar7 = iVar6;
              goto LAB_0022bee4;
            }
          }
          Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)pcVar14[lVar3]);
LAB_0022bee4:
          lVar13 = lVar3 + 1;
          lVar3 = lVar3 + 1;
          cVar1 = pcVar14[lVar13];
        }
      }
    }
    else {
      HandleArgument(this,&arg_index,pcVar14);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (arg[0] == '-') {
      if (arg[1] == '-') {
        // Long option.
        int best_index = -1;
        int best_length = 0;
        int best_count = 0;
        for (size_t j = 0; j < options_.size(); ++j) {
          const Option& option = options_[j];
          if (!option.long_name.empty()) {
            int match_length =
                Match(&arg[2], option.long_name, option.has_argument);
            if (match_length > best_length) {
              best_index = j;
              best_length = match_length;
              best_count = 1;
            } else if (match_length == best_length && best_length > 0) {
              best_count++;
            }
          }
        }

        if (best_count > 1) {
          Errorf("ambiguous option '%s'", arg);
          continue;
        } else if (best_count == 0) {
          Errorf("unknown option '%s'", arg);
          continue;
        }

        const Option& best_option = options_[best_index];
        const char* option_argument = nullptr;
        if (best_option.has_argument) {
          if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
              arg[best_length + 2] == '=') {  // +2 to skip "--".
            option_argument = &arg[best_length + 3];
          } else {
            if (i + 1 == argc || argv[i + 1][0] == '-') {
              Errorf("option '--%s' requires argument",
                     best_option.long_name.c_str());
              continue;
            }
            ++i;
            option_argument = argv[i];
          }
        }
        best_option.callback(option_argument);
      } else {
        // Short option.
        if (arg[1] == '\0') {
          // Just "-".
          HandleArgument(&arg_index, arg);
          continue;
        }

        // Allow short names to be combined, e.g. "-d -v" => "-dv".
        for (int k = 1; arg[k]; ++k) {
          bool matched = false;
          for (const Option& option : options_) {
            if (option.short_name && arg[k] == option.short_name) {
              const char* option_argument = nullptr;
              if (option.has_argument) {
                // A short option with a required argument cannot be followed
                // by other short options_.
                if (arg[k + 1] != '\0') {
                  Errorf("option '-%c' requires argument", option.short_name);
                  break;
                }

                if (i + 1 == argc || argv[i + 1][0] == '-') {
                  Errorf("option '-%c' requires argument", option.short_name);
                  break;
                }
                ++i;
                option_argument = argv[i];
              }
              option.callback(option_argument);
              matched = true;
              break;
            }
          }

          if (!matched) {
            Errorf("unknown option '-%c'", arg[k]);
            continue;
          }
        }
      }
    } else {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      Errorf("expected %s argument.", arguments_[i].name.c_str());
    }
  }
}